

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v7::vprint(FILE *f,string_view format_str,format_args args)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  size_t in_RDX;
  FILE *in_RSI;
  memory_buffer buffer;
  allocator<char> *in_stack_fffffffffffffd68;
  buffer<char> *this_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  locale_ref local_280 [3];
  size_t in_stack_fffffffffffffda8;
  void *in_stack_fffffffffffffdb0;
  allocator<char> local_241;
  buffer<char> local_240 [5];
  buffer<char> *in_stack_fffffffffffffe70;
  locale_ref in_stack_fffffffffffffe78;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_fffffffffffffe80;
  basic_string_view<char> in_stack_fffffffffffffe90;
  
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::allocator<char>::~allocator(&local_241);
  detail::locale_ref::locale_ref(local_280);
  detail::vformat_to<char>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe90,in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  this_00 = local_240;
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)
         detail::buffer<char>::data(this_00);
  detail::buffer<char>::size(this_00);
  detail::fwrite_fully(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_RDX,in_RSI);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str,
                     basic_format_args<buffer_context<char>>(args));
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(buffer.data(), buffer.size()));
    auto written = detail::dword();
    if (!detail::WriteConsoleW(reinterpret_cast<void*>(_get_osfhandle(fd)),
                               u16.c_str(), static_cast<uint32_t>(u16.size()),
                               &written, nullptr)) {
      FMT_THROW(format_error("failed to write to console"));
    }
    return;
  }
#endif
  detail::fwrite_fully(buffer.data(), 1, buffer.size(), f);
}